

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O0

void set_colour_bits(void)

{
  int iVar1;
  
  if (teletext == '\0') {
    colour_bits = (ubyte)((ulong)crt_regs[1] / (ulong)disp_chars);
    iVar1 = (int)((ulong)crt_regs[1] / (ulong)disp_chars);
    if (iVar1 == 1) {
      screen_byte_P = screen_byte_1;
    }
    else if (iVar1 == 2) {
      screen_byte_P = screen_byte_2;
    }
    else if (iVar1 == 4) {
      screen_byte_P = screen_byte_4;
    }
  }
  return;
}

Assistant:

void set_colour_bits(void)          // initialise colour functions
{
    if (!teletext)                               // only if in graphics mode
        switch (colour_bits = crt_regs[1] / disp_chars)   // calc bits per pixel
        {
            case 1:
                screen_byte_P = screen_byte_1;
                break; // point screen access func.
            case 2:
                screen_byte_P = screen_byte_2;
                break;
            case 4:
                screen_byte_P = screen_byte_4;
                break;
        }

}